

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int libxml_deprecationWarning(char *func)

{
  int iVar1;
  
  iVar1 = PyErr_WarnFormat(_PyExc_PendingDeprecationWarning,1,
                           "libxml2mod.%s is deprecated and will be removed in future versions",func
                          );
  return iVar1;
}

Assistant:

int
libxml_deprecationWarning(const char *func) {
#if PY_VERSION_HEX >= 0x03020000
    return PyErr_WarnFormat(PyExc_PendingDeprecationWarning, 1,
            "libxml2mod.%s is deprecated and will be removed "
            "in future versions", func);
#else
    return PyErr_WarnEx(PyExc_PendingDeprecationWarning, func, 1);
#endif
}